

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O3

decimal128_from_chars_result
jsoncons::bson::decimal128_from_chars(char *first,char *last,decimal128_t *dec)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  undefined8 uVar10;
  char cVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  char *pcVar15;
  uint64_t left;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  byte bVar21;
  decimal128_t *pdVar22;
  char *pcVar23;
  char cVar24;
  bool bVar25;
  type tVar26;
  decimal128_from_chars_result dVar27;
  uint16_t digits [34];
  int local_cc;
  decimal128_t *local_c8;
  long local_c0;
  short *local_b8;
  ulong local_b0;
  uint local_a4;
  char *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  bson_uint128_6464_t local_48;
  
  local_48.high = 0;
  local_48.low = 0;
  lVar12 = 0;
  local_58 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_cc = 0;
  dec->low = 0;
  dec->high = 0;
  bVar21 = *first;
  if ((bVar21 == 0x2d) || (bVar21 == 0x2b)) {
    local_b0 = (ulong)(bVar21 == 0x2d);
    bVar21 = first[1];
    lVar12 = 1;
    pcVar4 = first + 1;
  }
  else {
    local_b0 = 0;
    pcVar4 = first;
  }
  uVar2 = (uint)bVar21;
  bVar25 = bVar21 == 0x2e;
  if ((bVar25) || ((int)(char)bVar21 - 0x30U < 10)) {
    lVar20 = (long)last - (long)first;
    local_b8 = (short *)&local_98;
    iVar17 = 0;
    bVar13 = false;
    lVar6 = 0;
    local_c8 = (decimal128_t *)0x0;
    iVar1 = 0;
    uVar9 = 0;
    lVar19 = 0;
    do {
      while( true ) {
        pcVar23 = pcVar4 + 1;
        bVar21 = (byte)iVar17;
        if ((lVar20 != -1) && (last <= pcVar4)) goto LAB_001f0cef;
        if (!bVar25) break;
        if (iVar17 != 0) {
          dec->low = 0;
          goto LAB_001f101c;
        }
        uVar2 = (uint)*pcVar23;
        bVar25 = uVar2 == 0x2e;
        iVar17 = 1;
        pcVar4 = pcVar23;
        if (9 < uVar2 - 0x30 && !bVar25) {
          bVar21 = 1;
          goto LAB_001f0cef;
        }
      }
      local_c0 = lVar19;
      if (((ushort)uVar9 < 0x22) && (cVar11 = (char)uVar2, cVar11 != '0' || bVar13)) {
        lVar14 = lVar6;
        if (bVar13 != false) {
          lVar14 = lVar19;
        }
        if (cVar11 != '0') {
          lVar19 = lVar14;
        }
        *local_b8 = cVar11 + -0x30;
        local_b8 = local_b8 + 1;
        uVar9 = uVar9 + 1;
        bVar13 = true;
        local_c0 = lVar19;
      }
      local_c8 = (decimal128_t *)((long)local_c8 + (ulong)bVar13);
      iVar1 = iVar1 + iVar17;
      lVar6 = lVar6 + 1;
      uVar2 = (uint)*pcVar23;
      bVar25 = uVar2 == 0x2e;
      lVar19 = local_c0;
      pcVar4 = pcVar23;
    } while (bVar25 || uVar2 - 0x30 < 10);
LAB_001f0cef:
    pcVar23 = pcVar4;
    if ((lVar6 == 0 & bVar21) != 1) {
      if ((uVar2 & 0xff | 0x20) == 0x65) {
        local_b8 = (short *)CONCAT44(local_b8._4_4_,iVar1);
        pcVar23 = pcVar4 + 1;
        if (pcVar4[1] == '+') {
          pcVar23 = pcVar4 + 2;
        }
        local_c0 = lVar19;
        local_a4 = uVar9;
        local_a0 = last;
        tVar26 = jsoncons::detail::to_integer<int,char>
                           (pcVar23,(long)last - (long)pcVar23,&local_cc);
        pcVar4 = tVar26.ptr;
        if (tVar26.ec != success) goto LAB_001f100b;
        last = local_a0;
        lVar19 = local_c0;
        uVar9 = local_a4;
        iVar1 = (int)local_b8;
      }
      pcVar23 = pcVar4;
      if (((lVar20 != -1) && (last <= pcVar4)) || (*pcVar4 == '\0')) {
        uVar7 = (ulong)bVar21;
        if ((short)uVar9 == 0) {
          local_98 = local_98 & 0xffffffffffff0000;
          uVar8 = 1;
          uVar18 = 0;
          pdVar22 = (decimal128_t *)0x1;
          uVar3 = 0;
        }
        else {
          uVar8 = (ulong)(uVar9 & 0xffff);
          uVar3 = (long)local_c8 + 1;
          pcVar15 = first + lVar19 + (long)local_c8 + lVar12 + uVar7;
          do {
            pcVar15 = pcVar15 + -1;
            uVar3 = uVar3 - 1;
          } while (*pcVar15 == '0');
          uVar18 = (ulong)((uVar9 & 0xffff) - 1);
          pdVar22 = local_c8;
        }
        iVar17 = -0x1820;
        if (-(local_cc - iVar1) < 0x4001) {
          iVar17 = local_cc - iVar1;
        }
        iVar16 = local_cc - iVar1;
        bVar25 = iVar1 <= local_cc;
        local_cc = iVar17;
        if (iVar16 != 0 && bVar25) {
          local_cc = iVar16;
        }
        if (0x17df < local_cc) {
          do {
            uVar5 = uVar18;
            if (0x21 < uVar5) {
              if (uVar3 != 0) goto LAB_001f100b;
              local_cc = 0x17df;
              break;
            }
            local_cc = iVar16 + -1;
            bVar25 = 0x17e0 < iVar16;
            uVar18 = uVar5 + 1;
            iVar16 = local_cc;
          } while (bVar25);
          uVar18 = uVar5 + 1;
        }
        bVar25 = uVar8 < pdVar22;
        if ((local_cc < -0x1820) || (uVar8 < pdVar22)) {
          iVar17 = local_cc + -0x17df;
          iVar1 = local_cc;
          do {
            if (uVar18 == 0) {
              if (uVar3 != 0) goto LAB_001f100b;
              local_cc = -0x1820;
              goto LAB_001f104a;
            }
            if (bVar25) {
              if ((uVar3 != 0) && (first[(long)pdVar22 + uVar7 + lVar12 + -1] != '0'))
              goto LAB_001f100b;
              pdVar22 = (decimal128_t *)((long)pdVar22 - 1);
            }
            else {
              if (*(short *)((long)&local_98 + uVar18 * 2) != 0) goto LAB_001f100b;
              uVar18 = uVar18 - 1;
            }
            if (iVar17 == 0) goto LAB_001f100b;
            local_cc = iVar1 + 1;
            bVar25 = uVar8 < pdVar22;
            iVar17 = iVar17 + 1;
            bVar13 = iVar1 < -0x1821;
            iVar1 = local_cc;
          } while ((bVar13) || (uVar8 < pdVar22));
        }
        if (uVar18 + 1 < uVar3) {
          if (first[uVar7 + 1 + lVar12 + uVar18 + lVar19] != '0') goto LAB_001f100b;
LAB_001f0f87:
          uVar3 = local_98 & 0xffff;
          if (uVar18 < 0x11) {
            uVar7 = uVar3;
            if (uVar18 == 0) goto LAB_001f104c;
            left = 0;
            uVar3 = 0;
            do {
              uVar7 = (ulong)*(ushort *)((long)&local_98 + uVar3 * 2 + 2) + uVar7 * 10;
              uVar3 = uVar3 + 1;
            } while (uVar18 != uVar3);
          }
          else {
            uVar8 = 1;
            if (uVar18 != 0x11) {
              uVar8 = uVar18 - 0x10;
              lVar12 = 0;
              do {
                uVar3 = (ulong)*(ushort *)((long)&local_98 + lVar12 * 2 + 2) + uVar3 * 10;
                lVar12 = lVar12 + 1;
              } while (uVar18 - 0x11 != lVar12);
            }
            uVar7 = (ulong)*(ushort *)((long)&local_98 + uVar8 * 2);
            while (uVar8 = uVar8 + 1, left = uVar3, uVar8 <= uVar18) {
              uVar7 = (ulong)*(ushort *)((long)&local_98 + uVar8 * 2) + uVar7 * 10;
            }
          }
        }
        else {
          if (uVar3 != 0) goto LAB_001f0f87;
LAB_001f104a:
          uVar7 = 0;
LAB_001f104c:
          left = 0;
        }
        detail::mul_64x64(left,100000000000000000,&local_48);
        uVar3 = local_48.high + CARRY8(uVar7,local_48.low);
        if ((uVar3 & 0x2000000000000) == 0) {
          uVar3 = uVar3 & 0x1ffffffffffff | (ulong)(local_cc + 0x1820U & 0x3fff) << 0x31 | dec->high
          ;
        }
        else {
          uVar3 = (ulong)(local_cc + 0x1820U & 0xffff) << 0x2f | dec->high | 0x6000000000000000 |
                  uVar3 & 0x7fffffffffff;
        }
        dec->high = uVar3;
        dec->low = uVar7 + local_48.low;
        uVar10 = 0;
        if ((char)local_b0 == '\0') goto LAB_001f1025;
        uVar3 = uVar3 | 0x8000000000000000;
        uVar10 = 0;
        goto LAB_001f1021;
      }
    }
LAB_001f100b:
    dec->low = 0;
    pcVar4 = pcVar23;
LAB_001f101c:
    uVar3 = 0x7c00000000000000;
    uVar10 = 0x16;
  }
  else {
    local_c8 = dec;
    if (pcVar4 == last) goto LAB_001f0e2b;
    lVar12 = 0;
    do {
      lVar19 = lVar12;
      cVar11 = pcVar4[lVar19];
      iVar1 = isupper((int)cVar11);
      if (iVar1 != 0) {
        cVar11 = cVar11 + ' ';
      }
      cVar24 = "inf"[lVar19];
      iVar1 = isupper((int)cVar24);
      if (iVar1 != 0) {
        cVar24 = cVar24 + ' ';
      }
      if (cVar11 != cVar24) goto LAB_001f0b20;
    } while ((pcVar4 + lVar19 + 1 != last) && (lVar12 = lVar19 + 1, lVar19 != 2));
    if (pcVar4 + lVar19 + 1 == last && lVar19 == 2) {
LAB_001f0b96:
      uVar3 = ((ulong)(byte)~(byte)local_b0 << 0x3f) + 0xf800000000000000;
      uVar10 = 0;
      dec = local_c8;
      goto LAB_001f1021;
    }
LAB_001f0b20:
    if (pcVar4 == last) goto LAB_001f0e2b;
    lVar12 = 0;
    do {
      lVar19 = lVar12;
      cVar11 = pcVar4[lVar19];
      iVar1 = isupper((int)cVar11);
      if (iVar1 != 0) {
        cVar11 = cVar11 + ' ';
      }
      cVar24 = "test_decimal128_from_string__infinity"[lVar19 + 0x1d];
      iVar1 = isupper((int)cVar24);
      if (iVar1 != 0) {
        cVar24 = cVar24 + ' ';
      }
      if (cVar11 != cVar24) goto LAB_001f0dbd;
    } while ((pcVar4 + lVar19 + 1 != last) && (lVar12 = lVar19 + 1, lVar19 != 7));
    if (pcVar4 + lVar19 + 1 == last && lVar19 == 7) goto LAB_001f0b96;
LAB_001f0dbd:
    if (pcVar4 == last) {
LAB_001f0e2b:
      uVar10 = 0x16;
    }
    else {
      lVar12 = 0;
      do {
        lVar19 = lVar12;
        cVar11 = pcVar4[lVar19];
        iVar1 = isupper((int)cVar11);
        if (iVar1 != 0) {
          cVar11 = cVar11 + ' ';
        }
        cVar24 = "nan"[lVar19];
        iVar1 = isupper((int)cVar24);
        if (iVar1 != 0) {
          cVar24 = cVar24 + ' ';
        }
        if (cVar11 != cVar24) goto LAB_001f0e2b;
      } while ((pcVar4 + lVar19 + 1 != last) && (lVar12 = lVar19 + 1, lVar19 != 2));
      if (pcVar4 + lVar19 + 1 != last || lVar19 != 2) goto LAB_001f0e2b;
      uVar10 = 0;
    }
    uVar3 = 0x7c00000000000000;
    dec = local_c8;
  }
LAB_001f1021:
  dec->high = uVar3;
LAB_001f1025:
  dVar27._8_8_ = uVar10;
  dVar27.ptr = pcVar4;
  return dVar27;
}

Assistant:

inline
    decimal128_from_chars_result decimal128_from_chars(const char* first, const char* last, decimal128_t& dec) 
    {
        const string_view inf_str = "inf";
        const string_view infinity_str = "infinity";
        const string_view nan_str = "nan";

        ptrdiff_t len = last - first;

        bson_uint128_6464_t significand = {0,0};
 
        const char* str_read = first; /* Read pointer for consuming str. */
 
        /* Parsing state tracking */
        bool is_negative = false;
        bool saw_radix = false;
        bool includes_sign = false; /* True if the input first contains a sign. */
        bool found_nonzero = false;
 
        std::size_t significant_digits = 0; /* Total number of significant digits
                                        * (no leading or trailing zero) */
        std::size_t ndigits_read = 0;       /* Total number of significand digits read */
        std::size_t ndigits = 0;        /* Total number of digits (no leading zeros) */
        std::size_t radix_position = 0; /* The number of the digits after radix */
        std::size_t first_nonzero = 0;  /* The index of the first non-zero in *str* */
 
        uint16_t digits[decimal128_limits::max_digits] = {0};
        uint16_t ndigits_stored = 0;      /* The number of digits in digits */
        uint16_t *digits_insert = digits; /* Insertion pointer for digits */
        std::size_t first_digit = 0;           /* The index of the first non-zero digit */
        std::size_t last_digit = 0;            /* The index of the last digit */
 
        int32_t exponent = 0;
        uint64_t significand_high = 0; /* The high 17 digits of the significand */
        uint64_t significand_low = 0;  /* The low 17 digits of the significand */
        uint16_t biased_exponent = 0;  /* The biased exponent */
 
        dec.high = 0;
        dec.low = 0;
 
        if (*str_read == '+' || *str_read == '-') {
           is_negative = *(str_read++) == '-';
           includes_sign = true;
        }

        /* Check for Infinity or NaN */
        if (!isdigit(*str_read) && *str_read != '.') {
           if (detail::dec128_istreq (str_read, last, inf_str.data(), inf_str.data()+inf_str.length()) ||
               detail::dec128_istreq (str_read, last, infinity_str.data(), infinity_str.data()+infinity_str.length())) 
           {
               dec = is_negative ? decimal128_limits::neg_infinity() : decimal128_limits::infinity();
              return decimal128_from_chars_result{str_read,std::errc()};
           } else if (detail::dec128_istreq (str_read, last, nan_str.data(), nan_str.data()+nan_str.length())) {
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc()};
           }
 
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Read digits */
        while (((isdigit (*str_read) || *str_read == '.')) &&
               (len == -1 || str_read < first + len)) {
           if (*str_read == '.') {
              if (saw_radix) {
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
              saw_radix = true;
              str_read++;
              continue;
           }
 
           if (ndigits_stored < 34) {
              if (*str_read != '0' || found_nonzero) {
                 if (!found_nonzero) {
                    first_nonzero = ndigits_read;
                 }
 
                 found_nonzero = true;
                 *(digits_insert++) = *(str_read) - '0'; /* Only store 34 digits */
                 ndigits_stored++;
              }
           }
 
           if (found_nonzero) {
              ndigits++;
           }
 
           if (saw_radix) {
              radix_position++;
           }
 
           ndigits_read++;
           str_read++;
        }
 
        if (saw_radix && !ndigits_read) {
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Read exponent if exists */
        if (*str_read == 'e' || *str_read == 'E') {
           ++str_read;
           if (*str_read == '+') {
               ++str_read;
           }
           auto result = jsoncons::detail::to_integer(str_read, last - str_read, exponent);
           if (result.ec != jsoncons::detail::to_integer_errc()) 
           {
               dec = decimal128_limits::nan();
               return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
           str_read = result.ptr;
        }

        if ((len == -1 || str_read < first + len) && *str_read) {
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Done reading input. */
        /* Find first non-zero digit in digits */
        first_digit = 0;
 
        if (!ndigits_stored) { /* value is zero */
           first_digit = 0;
           last_digit = 0;
           digits[0] = 0;
           ndigits = 1;
           ndigits_stored = 1;
           significant_digits = 0;
        } else {
           last_digit = ndigits_stored - 1;
           significant_digits = ndigits;
           /* Mark trailing zeros as non-significant */
           while (first[first_nonzero + significant_digits - 1 + includes_sign +
                         saw_radix] == '0') {
              significant_digits--;
           }
        }
 
 
        /* Normalization of exponent */
        /* Correct exponent based on radix position, and shift significand as needed
         */
        /* to represent user input */
 
        /* Overflow prevention */
        if (exponent <= static_cast<int32_t>(radix_position) && static_cast<int32_t>(radix_position) - exponent > (1 << 14)) {
           exponent = decimal128_limits::exponent_min;
        } else {
           exponent -= static_cast<int32_t>(radix_position);
        }
 
        /* Attempt to normalize the exponent */
        while (exponent > decimal128_limits::exponent_max) {
           /* Shift exponent to significand and decrease */
           last_digit++;
 
           if (last_digit - first_digit > decimal128_limits::max_digits) {
              /* The exponent is too great to shift into the significand. */
              if (significant_digits == 0) {
                 /* Value is zero, we are allowed to clamp the exponent. */
                 exponent = decimal128_limits::exponent_max;
                 break;
              }
 
              /* Overflow is not permitted, error. */
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
 
           exponent--;
        }
 
        while (exponent < decimal128_limits::exponent_min || ndigits_stored < ndigits) {
           /* Shift last digit */
           if (last_digit == 0) {
              /* underflow is not allowed, but zero clamping is */
              if (significant_digits == 0) {
                 exponent = decimal128_limits::exponent_min;
                 break;
              }
 
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
 
           if (ndigits_stored < ndigits) {
              if (first[ndigits - 1 + includes_sign + saw_radix] - '0' != 0 &&
                  significant_digits != 0) {
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
              ndigits--; /* adjust to match digits not stored */
           } else {
              if (digits[last_digit] != 0) {
                 /* Inexact rounding is not allowed. */
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
 
              last_digit--; /* adjust to round */
           }
 
           if (exponent < decimal128_limits::exponent_max) {
              exponent++;
           } else {
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
        }
 
        /* Round */
        /* We've normalized the exponent, but might still need to round. */
        if (last_digit - first_digit + 1 < significant_digits) {
           uint8_t round_digit;
 
           /* There are non-zero digits after last_digit that need rounding. */
           /* We round to nearest, ties to even */
           round_digit =
              first[first_nonzero + last_digit + includes_sign + saw_radix + 1] -
              '0';
 
           if (round_digit != 0) {
              /* Inexact (non-zero) rounding is not allowed */
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
        }
 
        /* Encode significand */
        significand_high = 0,   /* The high 17 digits of the significand */
           significand_low = 0; /* The low 17 digits of the significand */
 
        if (significant_digits == 0) { /* read a zero */
           significand_high = 0;
           significand_low = 0;
        } else if (last_digit - first_digit < 17) {
           std::size_t d_idx = first_digit;
           significand_low = digits[d_idx++];
 
           for (; d_idx <= last_digit; d_idx++) {
              significand_low *= 10;
              significand_low += digits[d_idx];
              significand_high = 0;
           }
        } else {
           std::size_t d_idx = first_digit;
           significand_high = digits[d_idx++];
 
           for (; d_idx <= last_digit - 17; d_idx++) {
              significand_high *= 10;
              significand_high += digits[d_idx];
           }
 
           significand_low = digits[d_idx++];
 
           for (; d_idx <= last_digit; d_idx++) {
              significand_low *= 10;
              significand_low += digits[d_idx];
           }
        }
 
        detail::mul_64x64 (significand_high, 100000000000000000ull, &significand);
        significand.low += significand_low;
 
        if (significand.low < significand_low) {
           significand.high += 1;
        }
 
 
        biased_exponent = static_cast<uint16_t>(exponent + static_cast<int32_t>(decimal128_limits::exponent_bias));
 
        /* Encode combination, exponent, and significand. */
        if ((significand.high >> 49) & 1) {
           /* Encode '11' into bits 1 to 3 */
           dec.high |= (0x3ull << 61);
           dec.high |= (biased_exponent & 0x3fffull) << 47;
           dec.high |= significand.high & 0x7fffffffffffull;
        } else {
           dec.high |= (biased_exponent & 0x3fffull) << 49;
           dec.high |= significand.high & 0x1ffffffffffffull;
        }
 
        dec.low = significand.low;
 
        /* Encode sign */
        if (is_negative) {
           dec.high |= 0x8000000000000000ull;
        }
 
        return decimal128_from_chars_result{str_read,std::errc()};
    }